

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O1

void __thiscall
aim_t::EnterSectorPortal
          (aim_t *this,int position,double frac,sector_t_conflict *entersec,DAngle *newtoppitch,
          DAngle *newbottompitch)

{
  double dVar1;
  uint uVar2;
  char *pcVar3;
  char *pcVar4;
  subsector_t *psVar5;
  aim_t newtrace;
  aim_t local_160;
  
  uVar2 = entersec->Portals[position];
  dVar1 = sectorPortals.Array[uVar2].mPlaneZ;
  if (((position != 1) || (this->limitz <= dVar1)) && ((position != 0 || (dVar1 <= this->limitz))))
  {
    local_160.aimtrace.Y = (this->aimtrace).Y;
    local_160.aimtrace.X = (this->aimtrace).X;
    local_160.aimpitch.Degrees = (this->aimpitch).Degrees;
    local_160.aimtarget = this->aimtarget;
    local_160.attackrange = this->attackrange;
    local_160.shootthing = this->shootthing;
    local_160.friender = this->friender;
    local_160.shootz = this->shootz;
    local_160.unlinked = this->unlinked;
    local_160.flags = this->flags;
    local_160.toppitch = (DAngle)newtoppitch->Degrees;
    local_160.bottompitch = (DAngle)newbottompitch->Degrees;
    local_160.aimdir = (position != 1) + 1;
    local_160.startpos.X = sectorPortals.Array[uVar2].mDisplacement.X + (this->startpos).X;
    local_160.startpos.Y = sectorPortals.Array[uVar2].mDisplacement.Y + (this->startpos).Y;
    local_160.startpos.Z = (this->startpos).Z;
    local_160.startfrac = 1.0 / local_160.attackrange + frac;
    psVar5 = P_PointInSubsector(local_160.aimtrace.X * local_160.startfrac + local_160.startpos.X,
                                local_160.startfrac * (this->aimtrace).Y + local_160.startpos.Y);
    local_160.lastsector = psVar5->sector;
    pcVar4 = "linked_ceiling";
    local_160.limitz = dVar1;
    if (aimdebug.Value == true) {
      pcVar3 = "linked_ceiling";
      if (position == 0) {
        pcVar3 = "linked_floor";
      }
      Printf("-----Entering %s portal from sector %d to sector %d\n",pcVar3 + 7,
             (ulong)(uint)this->lastsector->sectornum,(ulong)(uint)(local_160.lastsector)->sectornum
            );
    }
    AimTraverse(&local_160);
    if (local_160.linetarget.frac < (this->linetarget).frac) {
      (this->linetarget).super_FTranslatedLineTarget.linetarget =
           local_160.linetarget.super_FTranslatedLineTarget.linetarget;
      (this->linetarget).super_FTranslatedLineTarget.angleFromSource.Degrees =
           local_160.linetarget.super_FTranslatedLineTarget.angleFromSource.Degrees;
      (this->linetarget).super_FTranslatedLineTarget.attackAngleFromSource.Degrees =
           local_160.linetarget.super_FTranslatedLineTarget.attackAngleFromSource.Degrees;
      (this->linetarget).super_FTranslatedLineTarget.unlinked =
           local_160.linetarget.super_FTranslatedLineTarget.unlinked;
      (this->linetarget).pitch.Degrees = local_160.linetarget.pitch.Degrees;
      (this->linetarget).frac = local_160.linetarget.frac;
    }
    if (local_160.thing_friend.frac < (this->thing_friend).frac) {
      (this->thing_friend).super_FTranslatedLineTarget.linetarget =
           local_160.thing_friend.super_FTranslatedLineTarget.linetarget;
      (this->thing_friend).super_FTranslatedLineTarget.angleFromSource.Degrees =
           local_160.thing_friend.super_FTranslatedLineTarget.angleFromSource.Degrees;
      (this->thing_friend).super_FTranslatedLineTarget.attackAngleFromSource.Degrees =
           local_160.thing_friend.super_FTranslatedLineTarget.attackAngleFromSource.Degrees;
      (this->thing_friend).super_FTranslatedLineTarget.unlinked =
           local_160.thing_friend.super_FTranslatedLineTarget.unlinked;
      (this->thing_friend).pitch.Degrees = local_160.thing_friend.pitch.Degrees;
      (this->thing_friend).frac = local_160.thing_friend.frac;
    }
    if (local_160.thing_other.frac < (this->thing_other).frac) {
      (this->thing_other).super_FTranslatedLineTarget.linetarget =
           local_160.thing_other.super_FTranslatedLineTarget.linetarget;
      (this->thing_other).super_FTranslatedLineTarget.angleFromSource.Degrees =
           local_160.thing_other.super_FTranslatedLineTarget.angleFromSource.Degrees;
      (this->thing_other).super_FTranslatedLineTarget.attackAngleFromSource.Degrees =
           local_160.thing_other.super_FTranslatedLineTarget.attackAngleFromSource.Degrees;
      (this->thing_other).super_FTranslatedLineTarget.unlinked =
           local_160.thing_other.super_FTranslatedLineTarget.unlinked;
      (this->thing_other).pitch.Degrees = local_160.thing_other.pitch.Degrees;
      (this->thing_other).frac = local_160.thing_other.frac;
    }
    if (aimdebug.Value == true) {
      if (position == 0) {
        pcVar4 = "linked_floor";
      }
      Printf("-----Exiting %s portal\n",pcVar4 + 7);
    }
  }
  return;
}

Assistant:

void EnterSectorPortal(int position, double frac, sector_t *entersec, DAngle newtoppitch, DAngle newbottompitch)
	{
		double portalz = entersec->GetPortalPlaneZ(position);

		if (position == sector_t::ceiling && portalz < limitz) return;
		else if (position == sector_t::floor && portalz > limitz) return;
		aim_t newtrace = Clone();


		newtrace.toppitch = newtoppitch;
		newtrace.bottompitch = newbottompitch;
		newtrace.aimdir = position == sector_t::ceiling? aim_t::aim_up : aim_t::aim_down;
		newtrace.startpos = startpos + entersec->GetPortalDisplacement(position);
		newtrace.startfrac = frac + 1. / attackrange;	// this is to skip the transition line to the portal which would produce a bogus opening
		newtrace.lastsector = P_PointInSector(newtrace.startpos + aimtrace * newtrace.startfrac);
		newtrace.limitz = portalz;
		if (aimdebug)
			Printf("-----Entering %s portal from sector %d to sector %d\n", position ? "ceiling" : "floor", lastsector->sectornum, newtrace.lastsector->sectornum);
		newtrace.AimTraverse();
		SetResult(linetarget, newtrace.linetarget);
		SetResult(thing_friend, newtrace.thing_friend);
		SetResult(thing_other, newtrace.thing_other);
		if (aimdebug)
			Printf("-----Exiting %s portal\n", position ? "ceiling" : "floor");
	}